

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O1

resolve_t Curl_resolv(connectdata *conn,char *hostname,int port,_Bool allowDOH,
                     Curl_dns_entry **entry)

{
  Curl_easy *data;
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  CURLcode CVar4;
  Curl_addrinfo *addr;
  undefined7 in_register_00000009;
  resolve_t rVar5;
  Curl_dns_entry *dns;
  int respwait;
  in_addr in;
  in6_addr in6;
  Curl_dns_entry *local_60;
  int local_54;
  undefined4 local_50;
  undefined1 local_4c [4];
  Curl_dns_entry **local_48;
  undefined1 local_40 [16];
  
  local_50 = (undefined4)CONCAT71(in_register_00000009,allowDOH);
  local_60 = (Curl_dns_entry *)0x0;
  data = conn->data;
  *entry = (Curl_dns_entry *)0x0;
  if (data->share != (Curl_share *)0x0) {
    Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
  }
  local_60 = fetch_addr(conn,hostname,port);
  if (local_60 == (Curl_dns_entry *)0x0) {
    rVar5 = CURLRESOLV_ERROR;
  }
  else {
    rVar5 = CURLRESOLV_RESOLVED;
    Curl_infof(data,"Hostname %s was found in DNS cache\n",hostname);
    local_60->inuse = local_60->inuse + 1;
  }
  if (data->share != (Curl_share *)0x0) {
    Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
  }
  if (local_60 != (Curl_dns_entry *)0x0) goto LAB_0010b8f9;
  local_54 = 0;
  local_48 = entry;
  if ((data->set).resolver_start == (curl_resolver_start_callback)0x0) {
LAB_0010b790:
    iVar3 = inet_pton(2,hostname,local_4c);
    if (iVar3 < 1) {
      addr = (Curl_addrinfo *)0x0;
    }
    else {
      addr = Curl_ip2addr(2,local_4c,hostname,port);
    }
    if (addr == (Curl_addrinfo *)0x0) {
      iVar3 = inet_pton(10,hostname,local_40);
      if (iVar3 < 1) {
        addr = (Curl_addrinfo *)0x0;
      }
      else {
        addr = Curl_ip2addr(10,local_40,hostname,port);
      }
    }
    if (addr == (Curl_addrinfo *)0x0) {
      _Var2 = Curl_ipvalid(conn);
      if (_Var2) {
        if (((char)local_50 == '\0') || (((data->set).field_0x8ee & 0x80) == 0)) {
          addr = Curl_getaddrinfo(conn,hostname,port,&local_54);
        }
        else {
          addr = Curl_doh(conn,hostname,port,&local_54);
        }
        goto LAB_0010b850;
      }
      bVar1 = false;
    }
    else {
LAB_0010b850:
      if (addr == (Curl_addrinfo *)0x0) {
        bVar1 = true;
        if (local_54 != 0) {
          CVar4 = Curl_resolv_check(conn,&local_60);
          if (CVar4 != CURLE_OK) goto LAB_0010b789;
          rVar5 = (resolve_t)(local_60 == (Curl_dns_entry *)0x0);
          bVar1 = true;
        }
      }
      else {
        if (data->share != (Curl_share *)0x0) {
          Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
        }
        local_60 = Curl_cache_addr(data,addr,hostname,port);
        if (data->share != (Curl_share *)0x0) {
          Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
        }
        bVar1 = true;
        if (local_60 == (Curl_dns_entry *)0x0) {
          Curl_freeaddrinfo(addr);
        }
        else {
          rVar5 = CURLRESOLV_RESOLVED;
          bVar1 = true;
        }
      }
    }
  }
  else {
    Curl_set_in_callback(data,true);
    iVar3 = (*(data->set).resolver_start)
                      ((data->state).resolver,(void *)0x0,(data->set).resolver_start_client);
    Curl_set_in_callback(data,false);
    if (iVar3 == 0) goto LAB_0010b790;
LAB_0010b789:
    bVar1 = false;
  }
  entry = local_48;
  if (!bVar1) {
    return CURLRESOLV_ERROR;
  }
LAB_0010b8f9:
  *entry = local_60;
  return rVar5;
}

Assistant:

enum resolve_t Curl_resolv(struct connectdata *conn,
                           const char *hostname,
                           int port,
                           bool allowDOH,
                           struct Curl_dns_entry **entry)
{
  struct Curl_dns_entry *dns = NULL;
  struct Curl_easy *data = conn->data;
  CURLcode result;
  enum resolve_t rc = CURLRESOLV_ERROR; /* default to failure */

  *entry = NULL;

  if(data->share)
    Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

  dns = fetch_addr(conn, hostname, port);

  if(dns) {
    infof(data, "Hostname %s was found in DNS cache\n", hostname);
    dns->inuse++; /* we use it! */
    rc = CURLRESOLV_RESOLVED;
  }

  if(data->share)
    Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

  if(!dns) {
    /* The entry was not in the cache. Resolve it to IP address */

    Curl_addrinfo *addr = NULL;
    int respwait = 0;
#ifndef USE_RESOLVE_ON_IPS
    struct in_addr in;
#endif

    /* notify the resolver start callback */
    if(data->set.resolver_start) {
      int st;
      Curl_set_in_callback(data, true);
      st = data->set.resolver_start(data->state.resolver, NULL,
                                    data->set.resolver_start_client);
      Curl_set_in_callback(data, false);
      if(st)
        return CURLRESOLV_ERROR;
    }

#ifndef USE_RESOLVE_ON_IPS
    /* First check if this is an IPv4 address string */
    if(Curl_inet_pton(AF_INET, hostname, &in) > 0)
      /* This is a dotted IP address 123.123.123.123-style */
      addr = Curl_ip2addr(AF_INET, &in, hostname, port);
#ifdef ENABLE_IPV6
    if(!addr) {
      struct in6_addr in6;
      /* check if this is an IPv6 address string */
      if(Curl_inet_pton(AF_INET6, hostname, &in6) > 0)
        /* This is an IPv6 address literal */
        addr = Curl_ip2addr(AF_INET6, &in6, hostname, port);
    }
#endif /* ENABLE_IPV6 */
#endif /* !USE_RESOLVE_ON_IPS */

    if(!addr) {
      /* Check what IP specifics the app has requested and if we can provide
       * it. If not, bail out. */
      if(!Curl_ipvalid(conn))
        return CURLRESOLV_ERROR;

      if(allowDOH && data->set.doh) {
        addr = Curl_doh(conn, hostname, port, &respwait);
      }
      else {
        /* If Curl_getaddrinfo() returns NULL, 'respwait' might be set to a
           non-zero value indicating that we need to wait for the response to
           the resolve call */
        addr = Curl_getaddrinfo(conn,
#ifdef DEBUGBUILD
                                (data->set.str[STRING_DEVICE]
                                 && !strcmp(data->set.str[STRING_DEVICE],
                                            "LocalHost"))?"localhost":
#endif
                                hostname, port, &respwait);
      }
    }
    if(!addr) {
      if(respwait) {
        /* the response to our resolve call will come asynchronously at
           a later time, good or bad */
        /* First, check that we haven't received the info by now */
        result = Curl_resolv_check(conn, &dns);
        if(result) /* error detected */
          return CURLRESOLV_ERROR;
        if(dns)
          rc = CURLRESOLV_RESOLVED; /* pointer provided */
        else
          rc = CURLRESOLV_PENDING; /* no info yet */
      }
    }
    else {
      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* we got a response, store it in the cache */
      dns = Curl_cache_addr(data, addr, hostname, port);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns)
        /* returned failure, bail out nicely */
        Curl_freeaddrinfo(addr);
      else
        rc = CURLRESOLV_RESOLVED;
    }
  }

  *entry = dns;

  return rc;
}